

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineDeviceComputer.cxx
# Opt level: O0

bool __thiscall
cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking
          (cmLinkLineDeviceComputer *this,cmComputeLinkInformation *cli)

{
  bool bVar1;
  ItemVector *this_00;
  const_iterator cVar2;
  const_iterator cVar3;
  ItemVector *items;
  cmComputeLinkInformation *cli_local;
  cmLinkLineDeviceComputer *this_local;
  
  this_00 = cmComputeLinkInformation::GetItems(cli);
  cVar2 = std::
          vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
          begin(this_00);
  cVar3 = std::
          vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
          end(this_00);
  bVar1 = std::
          any_of<__gnu_cxx::__normal_iterator<cmComputeLinkInformation::Item_const*,std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>>,cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking(cmComputeLinkInformation&)::__0>
                    (cVar2._M_current,cVar3._M_current);
  return bVar1;
}

Assistant:

bool cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking(
  cmComputeLinkInformation& cli)
{
  // Determine if this item might requires device linking.
  // For this we only consider targets
  using ItemVector = cmComputeLinkInformation::ItemVector;
  ItemVector const& items = cli.GetItems();
  return std::any_of(
    items.begin(), items.end(),
    [](cmComputeLinkInformation::Item const& item) -> bool {
      return item.Target &&
        item.Target->GetType() == cmStateEnums::STATIC_LIBRARY &&
        // this dependency requires us to device link it
        !item.Target->GetPropertyAsBool("CUDA_RESOLVE_DEVICE_SYMBOLS") &&
        item.Target->GetPropertyAsBool("CUDA_SEPARABLE_COMPILATION");
    });
}